

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_empty.c
# Opt level: O0

int archive_read_support_format_empty(archive *_a)

{
  int iVar1;
  _func_int_archive_read_ptr_void_ptr_ptr_size_t_ptr_int64_t_ptr *in_RDI;
  _func_int64_t_archive_read_ptr_int64_t_int *unaff_retaddr;
  _func_int_archive_read_ptr *in_stack_00000008;
  _func_int_archive_read_ptr *in_stack_00000010;
  _func_int_archive_read_ptr *in_stack_00000018;
  int magic_test;
  int r;
  archive_read *a;
  uint in_stack_00000050;
  uint in_stack_00000054;
  archive *in_stack_00000058;
  archive_read *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = __archive_check_magic(in_stack_00000058,in_stack_00000054,in_stack_00000050,(char *)_a);
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    iVar1 = __archive_read_register_format
                      (in_stack_ffffffffffffffd8,(void *)0x0,(char *)0x0,
                       (_func_int_archive_read_ptr_int *)0x0,
                       (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                       (_func_int_archive_read_ptr_archive_entry_ptr *)0x0,in_RDI,
                       (_func_int_archive_read_ptr *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),unaff_retaddr,
                       in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_empty(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_empty");

	r = __archive_read_register_format(a,
	    NULL,
	    NULL,
	    archive_read_format_empty_bid,
	    NULL,
	    archive_read_format_empty_read_header,
	    archive_read_format_empty_read_data,
	    NULL,
	    NULL,
	    NULL,
	    NULL,
	    NULL);

	return (r);
}